

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O1

int Aig_ManHasNoGaps(Aig_Man_t *p)

{
  return (uint)(p->vObjs->nSize - p->nDeleted ==
               p->nObjs[6] + p->nObjs[2] + p->nObjs[3] + p->nObjs[5] + 1);
}

Assistant:

static inline int          Aig_ManObjNum( Aig_Man_t * p )         { return Vec_PtrSize(p->vObjs) - p->nDeleted;      }